

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void QWhatsThisPrivate::notifyToplevels(QEvent *e)

{
  bool bVar1;
  const_iterator o;
  QWidget **ppQVar2;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QWidgetList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QWidgetList toplevels;
  QList<QWidget_*> *in_stack_ffffffffffffffb0;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_28.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QWidget_*>::begin(in_stack_ffffffffffffffb0);
  o = QList<QWidget_*>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    ppQVar2 = QList<QWidget_*>::const_iterator::operator*(&local_28);
    QCoreApplication::sendEvent(&(*ppQVar2)->super_QObject,in_RDI);
    QList<QWidget_*>::const_iterator::operator++(&local_28);
  }
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x4c3c7e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThisPrivate::notifyToplevels(QEvent *e)
{
    const QWidgetList toplevels = QApplication::topLevelWidgets();
    for (auto *w : toplevels)
        QCoreApplication::sendEvent(w, e);
}